

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> __thiscall
jbcoin::Logs::makeSink(Logs *this,string *name,Severity threshold)

{
  undefined4 in_register_00000014;
  undefined1 local_30 [16];
  undefined1 auStack_20 [4];
  Severity threshold_local;
  string *name_local;
  Logs *this_local;
  
  _auStack_20 = CONCAT44(in_register_00000014,threshold);
  name_local = name;
  this_local = this;
  std::
  make_unique<jbcoin::Logs::Sink,std::__cxx11::string_const&,beast::severities::Severity&,jbcoin::Logs&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (Severity *)_auStack_20,(Logs *)(local_30 + 0xc));
  std::unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>>::
  unique_ptr<jbcoin::Logs::Sink,std::default_delete<jbcoin::Logs::Sink>,void>
            ((unique_ptr<beast::Journal::Sink,std::default_delete<beast::Journal::Sink>> *)this,
             (unique_ptr<jbcoin::Logs::Sink,_std::default_delete<jbcoin::Logs::Sink>_> *)local_30);
  std::unique_ptr<jbcoin::Logs::Sink,_std::default_delete<jbcoin::Logs::Sink>_>::~unique_ptr
            ((unique_ptr<jbcoin::Logs::Sink,_std::default_delete<jbcoin::Logs::Sink>_> *)local_30);
  return (__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
          )(__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<beast::Journal::Sink>
Logs::makeSink(std::string const& name,
    beast::severities::Severity threshold)
{
    return std::make_unique<Sink>(
        name, threshold, *this);
}